

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcVector.h
# Opt level: O1

void __thiscall o3dgc::Vector<long>::PushBack(Vector<long> *this,long *value)

{
  unsigned_long uVar1;
  long *__src;
  ulong uVar2;
  long lVar3;
  long *__dest;
  ulong uVar4;
  
  uVar1 = this->m_size;
  if (uVar1 == this->m_allocated) {
    uVar2 = this->m_allocated * 2;
    uVar4 = 0x20;
    if (0x20 < uVar2) {
      uVar4 = uVar2;
    }
    this->m_allocated = uVar4;
    __dest = (long *)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar4 << 3);
    if (uVar1 != 0) {
      __src = this->m_buffer;
      memcpy(__dest,__src,uVar1 << 3);
      if (__src != (long *)0x0) {
        operator_delete__(__src);
      }
    }
    this->m_buffer = __dest;
  }
  uVar2 = this->m_size;
  if (uVar2 < this->m_allocated) {
    lVar3 = *value;
    this->m_size = uVar2 + 1;
    this->m_buffer[uVar2] = lVar3;
    return;
  }
  __assert_fail("m_size < m_allocated",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcVector.h"
                ,0x58,"void o3dgc::Vector<long>::PushBack(const T &) [T = long]");
}

Assistant:

void                    PushBack(const T & value)
                                {
                                    if (m_size == m_allocated)
                                    {
                                        m_allocated *= 2;
                                        if (m_allocated < O3DGC_DEFAULT_VECTOR_SIZE)
                                        {
                                            m_allocated = O3DGC_DEFAULT_VECTOR_SIZE;
                                        }
                                        T * tmp      = new T [m_allocated];
                                        if (m_size > 0)
                                        {
                                            memcpy(tmp, m_buffer, m_size * sizeof(T) );
                                            delete [] m_buffer;
                                        }
                                        m_buffer = tmp;
                                    }
                                    assert(m_size < m_allocated);
                                    m_buffer[m_size++] = value;
                                }